

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O0

cfg_entry * cfg_db_find_entry(cfg_db *db,char *section_type,char *section_name,char *entry_name)

{
  cfg_named_section *pcVar1;
  cfg_entry *local_50;
  cfg_entry *local_48;
  cfg_entry *entry;
  cfg_named_section *named;
  char *entry_name_local;
  char *section_name_local;
  char *section_type_local;
  cfg_db *db_local;
  
  local_48 = (cfg_entry *)0x0;
  pcVar1 = cfg_db_find_namedsection(db,section_type,section_name);
  if (pcVar1 != (cfg_named_section *)0x0) {
    local_50 = (cfg_entry *)avl_find(&pcVar1->entries,entry_name);
    if (local_50 == (cfg_entry *)0x0) {
      local_50 = (cfg_entry *)0x0;
    }
    local_48 = local_50;
  }
  return local_48;
}

Assistant:

struct cfg_entry *
cfg_db_find_entry(struct cfg_db *db, const char *section_type, const char *section_name, const char *entry_name) {
  struct cfg_named_section *named;
  struct cfg_entry *entry = NULL;

  /* get named section */
  named = cfg_db_find_namedsection(db, section_type, section_name);
  if (named != NULL) {
    entry = avl_find_element(&named->entries, entry_name, entry, node);
  }
  return entry;
}